

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_seqnum_t fdb_kvs_get_committed_seqnum(fdb_kvs_handle *handle)

{
  long lVar1;
  uint8_t *puVar2;
  int64_t iVar3;
  long alStack_100 [9];
  undefined8 local_b8;
  undefined8 local_b0;
  docio_object doc;
  kvs_header *kv_header;
  int64_t doc_offset;
  filemgr *file;
  char *compacted_filename;
  fdb_kvs_id_t id;
  fdb_seqnum_t seqnum;
  bid_t hdr_bid;
  size_t len;
  uint64_t kv_info_offset;
  uint64_t version;
  uint64_t dummy64;
  uint8_t *buf;
  fdb_kvs_handle *handle_local;
  
  buf = (uint8_t *)handle;
  id = 0xffffffffffffffff;
  compacted_filename = (char *)0x0;
  file = (filemgr *)0x0;
  lVar1 = -((long)handle->file->config->blocksize + 0xfU & 0xfffffffffffffff0);
  dummy64 = (long)&local_b8 + lVar1;
  if ((handle->kvs != (kvs_info *)0x0) && (handle->kvs->id != 0)) {
    compacted_filename = (char *)handle->kvs->id;
  }
  *(undefined8 *)((long)alStack_100 + lVar1 + 0x40) = 0x162139;
  seqnum = filemgr_get_header_bid(*(filemgr **)((long)&local_b0 + lVar1));
  if (seqnum == 0xffffffffffffffff) {
    handle_local = (fdb_kvs_handle *)0x0;
  }
  else {
    puVar2 = buf + 0x168;
    *(undefined8 *)((long)alStack_100 + lVar1 + 0x28) = 0;
    *(uint64_t **)((long)alStack_100 + lVar1 + 0x30) = &kv_info_offset;
    *(undefined8 *)((long)alStack_100 + lVar1 + 0x38) = 0;
    *(uint8_t **)((long)alStack_100 + lVar1 + 0x40) = puVar2;
    *(undefined8 *)((long)alStack_100 + lVar1 + 0x20) = 0x16219a;
    filemgr_fetch_header
              (*(filemgr **)((long)&len + lVar1),*(uint64_t *)((long)&hdr_bid + lVar1),
               *(void **)((long)&seqnum + lVar1),*(size_t **)((long)&id + lVar1),
               *(fdb_seqnum_t **)((long)&compacted_filename + lVar1),
               *(filemgr_header_revnum_t **)((long)&file + lVar1),
               *(uint64_t **)((long)&handle_local + lVar1),
               *(uint64_t **)(&stack0xfffffffffffffff8 + lVar1),
               *(uint64_t **)(&stack0x00000000 + lVar1),
               *(err_log_callback **)(&stack0x00000008 + lVar1));
    if (compacted_filename != (char *)0x0) {
      local_b8 = &version;
      *(uint64_t **)((long)alStack_100 + lVar1 + 8) = &version;
      *(uint64_t **)((long)alStack_100 + lVar1 + 0x10) = &version;
      *(uint64_t **)((long)alStack_100 + lVar1 + 0x18) = &version;
      *(uint64_t **)((long)alStack_100 + lVar1 + 0x20) = &version;
      *(size_t **)((long)alStack_100 + lVar1 + 0x28) = &len;
      *(uint64_t **)((long)alStack_100 + lVar1 + 0x30) = &version;
      *(filemgr ***)((long)alStack_100 + lVar1 + 0x38) = &file;
      *(undefined8 *)((long)alStack_100 + lVar1 + 0x40) = 0;
      *(undefined8 *)((long)alStack_100 + lVar1) = 0x162206;
      fdb_fetch_header(*(uint64_t *)((long)alStack_100 + lVar1 + 0x40),
                       *(void **)((long)alStack_100 + lVar1 + 0x38),
                       *(bid_t **)((long)alStack_100 + lVar1 + 0x30),
                       *(bid_t **)((long)alStack_100 + lVar1 + 0x28),
                       *(bid_t **)((long)alStack_100 + lVar1 + 0x20),
                       *(uint64_t **)((long)alStack_100 + lVar1 + 0x18),
                       *(uint64_t **)((long)&local_b0 + lVar1),*(uint64_t **)((long)&doc + lVar1),
                       *(uint64_t **)((long)&doc + lVar1 + 8),
                       *(uint64_t **)((long)&doc + lVar1 + 0x10),
                       *(uint64_t **)((long)&doc + lVar1 + 0x18),
                       *(uint64_t **)((long)&doc + lVar1 + 0x20),
                       *(char ***)((long)&doc + lVar1 + 0x28),*(char ***)((long)&doc + lVar1 + 0x30)
                      );
      *(undefined8 *)((long)alStack_100 + lVar1 + 0x40) = 0x162216;
      docio_object::docio_object(*(docio_object **)((long)&local_b0 + lVar1));
      *(undefined8 *)((long)alStack_100 + lVar1 + 0x40) = 0x16221f;
      _fdb_kvs_header_create(*(kvs_header ***)((long)&local_b0 + lVar1));
      *(undefined8 *)((long)alStack_100 + lVar1 + 0x40) = 0x162232;
      memset(&local_b0,0,0x38);
      *(undefined8 *)((long)alStack_100 + lVar1 + 0x40) = 0x16224f;
      iVar3 = docio_read_doc(*(docio_handle **)(&stack0x00000068 + lVar1),
                             *(uint64_t *)(&stack0x00000060 + lVar1),
                             *(docio_object **)(&stack0x00000058 + lVar1),
                             (bool)(&stack0x00000057)[lVar1]);
      if (iVar3 < 1) {
        *(undefined8 *)((long)alStack_100 + lVar1 + 0x40) = 0x162263;
        _fdb_kvs_header_free(*(kvs_header **)((long)&local_b0 + lVar1));
        return 0;
      }
      *(undefined8 *)((long)alStack_100 + lVar1 + 0x40) = 0x162289;
      _fdb_kvs_header_import
                (*(kvs_header **)(&stack0x000000e0 + lVar1),*(void **)(&stack0x000000d8 + lVar1),
                 *(size_t *)(&stack0x000000d0 + lVar1),*(uint64_t *)(&stack0x000000c8 + lVar1),
                 (bool)(&stack0x000000c7)[lVar1]);
      *(undefined8 *)((long)alStack_100 + lVar1 + 0x40) = 0x16229e;
      id = _fdb_kvs_get_seqnum(*(kvs_header **)(&stack0x00000030 + lVar1),
                               *(fdb_kvs_id_t *)(&stack0x00000028 + lVar1));
      *(undefined8 *)((long)alStack_100 + lVar1 + 0x40) = 0x1622ab;
      _fdb_kvs_header_free(*(kvs_header **)((long)&local_b0 + lVar1));
      *(undefined8 *)((long)alStack_100 + lVar1 + 0x40) = 0x1622c0;
      free_docio_object(*(docio_object **)((long)&local_b0 + lVar1),
                        *(uint8_t *)((long)&local_b8 + lVar1 + 7),
                        *(uint8_t *)((long)&local_b8 + lVar1 + 6),
                        *(uint8_t *)((long)&local_b8 + lVar1 + 5));
    }
    handle_local = (fdb_kvs_handle *)id;
  }
  return (fdb_seqnum_t)handle_local;
}

Assistant:

fdb_seqnum_t fdb_kvs_get_committed_seqnum(fdb_kvs_handle *handle)
{
    uint8_t *buf;
    uint64_t dummy64;
    uint64_t version;
    uint64_t kv_info_offset;
    size_t len;
    bid_t hdr_bid;
    fdb_seqnum_t seqnum = SEQNUM_NOT_USED;
    fdb_kvs_id_t id = 0;
    char *compacted_filename = NULL;
    struct filemgr *file = handle->file;

    buf = alca(uint8_t, file->config->blocksize);

    if (handle->kvs && handle->kvs->id > 0) {
        id = handle->kvs->id;
    }

    hdr_bid = filemgr_get_header_bid(file);
    if (hdr_bid == BLK_NOT_FOUND) {
        // header doesn't exist
        return 0;
    }

    // read header
    filemgr_fetch_header(file, hdr_bid, buf, &len, &seqnum, NULL, NULL,
                         &version, NULL, &handle->log_callback);
    if (id > 0) { // non-default KVS
        // read last KVS header
        fdb_fetch_header(version, buf, &dummy64, &dummy64,
                         &dummy64, &dummy64, &dummy64, &dummy64,
                         &dummy64, &dummy64,
                         &kv_info_offset, &dummy64,
                         &compacted_filename, NULL);

        int64_t doc_offset;
        struct kvs_header *kv_header;
        struct docio_object doc;

        _fdb_kvs_header_create(&kv_header);
        memset(&doc, 0, sizeof(struct docio_object));
        doc_offset = docio_read_doc(handle->dhandle,
                                    kv_info_offset, &doc, true);

        if (doc_offset <= 0) {
            // fail
            _fdb_kvs_header_free(kv_header);
            return 0;

        } else {
            _fdb_kvs_header_import(kv_header, doc.body,
                                   doc.length.bodylen, version, false);
            // get local sequence number for the KV instance
            seqnum = _fdb_kvs_get_seqnum(kv_header,
                                         handle->kvs->id);
            _fdb_kvs_header_free(kv_header);
            free_docio_object(&doc, 1, 1, 1);
        }
    }
    return seqnum;
}